

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

options_i * load_header_merge_options(options_i *options,vw *all,io_buf *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  pointer pbVar9;
  long *plVar10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer pbVar12;
  bool bVar13;
  string saved_key;
  string file_options;
  basic_option<char> opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  container;
  parsed_options pos;
  options_description desc;
  istringstream ss;
  undefined1 *local_3f0;
  char *local_3e8;
  undefined1 local_3e0 [16];
  string local_3d0;
  undefined8 local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [32];
  long *local_378 [2];
  undefined1 local_368 [48];
  options_description *local_338;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  pointer local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  string local_2d8;
  basic_parsed_options<char> local_2b8;
  undefined1 *local_290 [2];
  undefined1 local_280 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_268 [24];
  void *local_250;
  undefined4 local_248;
  undefined8 local_240;
  undefined4 local_238;
  undefined8 local_230;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_228 [24];
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_210;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1e0;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  save_load_header(all,model,true,false,&local_3d0,options);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_3d0._M_dataplus._M_p,
             local_3d0._M_dataplus._M_p + local_3d0._M_string_length);
  interactions_settings_doubled = check_interaction_settings_collision(options,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3d0,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_1e0,(istream_type *)local_1b0);
  paVar1 = &local_210._M_value.field_2;
  local_210._M_stream = (istream_type *)0x0;
  local_210._M_value._M_string_length = 0;
  local_210._M_value.field_2._M_local_buf[0] = '\0';
  local_210._M_ok = false;
  local_210._M_value._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2f0,
             &local_1e0,&local_210,(allocator_type *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_value._M_dataplus._M_p != &local_1e0._M_value.field_2) {
    operator_delete(local_1e0._M_value._M_dataplus._M_p);
  }
  local_3a8._0_8_ = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"");
  boost::program_options::options_description::options_description
            ((options_description *)local_290,(string *)local_3a8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
    operator_delete((void *)local_3a8._0_8_);
  }
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_3a8,&local_2f0);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_3a8)
  ;
  local_338 = (options_description *)local_290;
  boost::program_options::detail::cmdline::allow_unregistered();
  boost::program_options::basic_command_line_parser<char>::run
            (&local_2b8,(basic_command_line_parser<char> *)local_3a8);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)(local_368 + 0x10));
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3a8);
  local_3f0 = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"");
  local_310 = local_2b8.options.
              super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2b8.options.
      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2b8.options.
      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = false;
    iVar6 = 0;
    local_3b0 = 0;
    pbVar12 = local_2b8.options.
              super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_3a8._0_8_ = local_398;
      pcVar2 = (pbVar12->string_key)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3a8,pcVar2,pcVar2 + (pbVar12->string_key)._M_string_length);
      local_398._16_4_ = pbVar12->position_key;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_398 + 0x18),&pbVar12->value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_368,&pbVar12->original_tokens);
      uVar8 = local_368._8_8_;
      local_368[0x18] = pbVar12->unregistered;
      local_368[0x19] = pbVar12->case_insensitive;
      pbVar9 = (pointer)local_368._0_8_;
      if (bVar3) {
        for (; pbVar9 != (pointer)uVar8; pbVar9 = pbVar9 + 1) {
          pcVar2 = (pbVar9->_M_dataplus)._M_p;
          local_330[0] = local_320;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_330,pcVar2,pcVar2 + pbVar9->_M_string_length);
          lVar7 = std::__cxx11::string::find((char *)local_330,0x27e5b5,0);
          if (lVar7 != -1) {
            bVar3 = false;
          }
          if (local_330[0] != local_320) {
            operator_delete(local_330[0]);
          }
        }
        if (!bVar3) goto LAB_0012d86d;
        std::__cxx11::string::_M_replace((ulong)&local_3f0,0,local_3e8,0x277f85);
      }
      else {
LAB_0012d86d:
        if (((ulong)local_3a8._8_8_ < (pointer)0x2) ||
           (*(char *)&((_Alloc_hider *)local_3a8._0_8_)->_M_p != '-')) {
          bVar13 = false;
        }
        else {
          bVar13 = (byte)(*(char *)((long)&((_Alloc_hider *)local_3a8._0_8_)->_M_p + 1) - 0x30U) <
                   10;
        }
        if ((interactions_settings_doubled == true) &&
           (((iVar5 = std::__cxx11::string::compare(local_3a8), iVar5 == 0 ||
             (iVar5 = std::__cxx11::string::compare(local_3a8), iVar5 == 0)) ||
            (iVar5 = std::__cxx11::string::compare(local_3a8), iVar5 == 0)))) {
          bVar3 = true;
        }
        else {
          __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_368;
          if (!bVar13) {
            iVar5 = std::__cxx11::string::compare(local_3a8);
            __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_398 + 0x18);
            if (iVar5 != 0) {
              if ((iVar6 == 0 & (byte)local_3b0) == 1) {
                local_330[0] = local_320;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
                (*options->_vptr_options_i[5])(options,&local_3f0,(string *)local_330);
                if (local_330[0] != local_320) {
                  operator_delete(local_330[0]);
                }
              }
              uVar8 = std::__cxx11::string::_M_assign((string *)&local_3f0);
              plVar4 = local_378[0];
              local_3b0 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
              if (local_378[0] == (long *)local_398._24_8_) {
                iVar6 = 0;
              }
              else {
                iVar6 = 0;
                plVar10 = (long *)local_398._24_8_;
                do {
                  local_330[0] = local_320;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_330,*plVar10,*plVar10 + plVar10[1]);
                  (*options->_vptr_options_i[5])(options,&local_3f0,(string *)local_330);
                  if (local_330[0] != local_320) {
                    operator_delete(local_330[0]);
                  }
                  plVar10 = plVar10 + 4;
                  iVar6 = iVar6 + 1;
                } while (plVar10 != plVar4);
              }
              goto LAB_0012da62;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_308,__x);
          pbVar9 = local_308.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar11 = local_308.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar9;
              pbVar11 = pbVar11 + 1) {
            pcVar2 = (pbVar11->_M_dataplus)._M_p;
            local_330[0] = local_320;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_330,pcVar2,pcVar2 + pbVar11->_M_string_length);
            (*options->_vptr_options_i[5])(options,&local_3f0,(string *)local_330);
            if (local_330[0] != local_320) {
              operator_delete(local_330[0]);
            }
            iVar6 = iVar6 + 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_308);
        }
      }
LAB_0012da62:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_368);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_398 + 0x18));
      if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
        operator_delete((void *)local_3a8._0_8_);
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != local_310);
    if (iVar6 != 0) goto LAB_0012db17;
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_3f0);
  if (iVar6 != 0) {
    local_3a8._0_8_ = local_398;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"");
    (*options->_vptr_options_i[5])(options,&local_3f0,local_3a8);
    if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
      operator_delete((void *)local_3a8._0_8_);
    }
  }
LAB_0012db17:
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_2b8.options);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_228);
  if (local_250 != (void *)0x0) {
    operator_delete(local_250);
    local_250 = (void *)0x0;
    local_248 = 0;
    local_240 = 0;
    local_238 = 0;
    local_230 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_268);
  if (local_290[0] != local_280) {
    operator_delete(local_290[0]);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f0);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  return options;
}

Assistant:

options_i& load_header_merge_options(options_i& options, vw& all, io_buf& model)
{
  std::string file_options;
  save_load_header(all, model, true, false, file_options, options);

  interactions_settings_doubled = check_interaction_settings_collision(options, file_options);

  // Convert file_options into a vector.
  std::istringstream ss{file_options};
  std::vector<std::string> container{std::istream_iterator<std::string>{ss}, std::istream_iterator<std::string>{}};

  po::options_description desc("");

  // Get list of options in file options string
  po::parsed_options pos = po::command_line_parser(container).options(desc).allow_unregistered().run();

  bool skipping = false;
  std::string saved_key = "";
  unsigned int count = 0;
  bool first_seen = false;
  for (auto opt : pos.options)
  {
    // If we previously encountered an option we want to skip, ignore tokens without --.
    if (skipping)
    {
      for (auto token : opt.original_tokens)
      {
        auto found = token.find("--");
        if (found != std::string::npos)
        {
          skipping = false;
        }
      }

      if (skipping)
      {
        saved_key = "";
        continue;
      }
    }

    bool treat_as_value = false;
    // If the key starts with a digit, this is a mis-interpretation of a value as a key. Pull it into the previous
    // option. This was found in the case of --lambda -1, misinterpreting -1 as an option key. The easy way to fix this
    // requires introducing "identifier-like" semantics for options keys, e.g. "does not begin with a digit". That does
    // not seem like an unreasonable restriction. The logical check here is: is "string_key" of the form {'-', <digit>,
    // <etc.>}.
    if (opt.string_key.length() > 1 && opt.string_key[0] == '-' && opt.string_key[1] >= '0' && opt.string_key[1] <= '9')
    {
      treat_as_value = true;
    }

    // If the interaction settings are doubled, the copy in the model file is ignored.
    if (interactions_settings_doubled &&
        (opt.string_key == "quadratic" || opt.string_key == "cubic" || opt.string_key == "interactions"))
    {
      // skip this option.
      skipping = true;
      continue;
    }

    // File options should always use long form.

    // If the key is empty this must be a value, otherwise set the key.
    if (!treat_as_value && opt.string_key != "")
    {
      // If the new token is a new option and there were no values previously it was a bool option. Add it as a switch.
      if (count == 0 && first_seen)
      {
        options.insert(saved_key, "");
      }

      saved_key = opt.string_key;
      count = 0;
      first_seen = true;

      if (opt.value.size() > 0)
      {
        for (auto value : opt.value)
        {
          options.insert(saved_key, value);
          count++;
        }
      }
    }
    else
    {
      // If treat_as_value is set, boost incorrectly interpreted the token as containing an option key
      // In this case, what should have happened is all original_tokens items should be in value.
      auto source = treat_as_value ? opt.original_tokens : opt.value;
      for (auto value : source)
      {
        options.insert(saved_key, value);
        count++;
      }
    }
  }

  if (count == 0 && saved_key != "")
  {
    options.insert(saved_key, "");
  }

  return options;
}